

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall re2::DFA::StateEqual::operator()(StateEqual *this,State *a,State *b)

{
  int local_2c;
  int i;
  State *b_local;
  State *a_local;
  StateEqual *this_local;
  
  if (a == b) {
    this_local._7_1_ = true;
  }
  else if ((a == (State *)0x0) || (b == (State *)0x0)) {
    this_local._7_1_ = false;
  }
  else if (a->ninst_ == b->ninst_) {
    if (a->flag_ == b->flag_) {
      for (local_2c = 0; local_2c < a->ninst_; local_2c = local_2c + 1) {
        if (a->inst_[local_2c] != b->inst_[local_2c]) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const State* a, const State* b) const {
      if (a == b)
        return true;
      if (a == NULL || b == NULL)
        return false;
      if (a->ninst_ != b->ninst_)
        return false;
      if (a->flag_ != b->flag_)
        return false;
      for (int i = 0; i < a->ninst_; i++)
        if (a->inst_[i] != b->inst_[i])
          return false;
      return true;  // they're equal
    }